

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtIntersectXor(word *pOut,int fComp,word *pIn0,word *pIn1,int fComp01,int nWords)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  if (0 < fComp01) {
    uVar5 = (ulong)(uint)fComp01;
  }
  if ((int)pIn1 == 0) {
    uVar4 = 0;
    do {
      if (uVar5 == uVar4) {
        return 0;
      }
      puVar2 = pIn0 + uVar4;
      lVar1 = uVar4 * 8;
      puVar3 = pOut + uVar4;
      uVar4 = uVar4 + 1;
    } while ((*puVar3 & (*puVar2 ^ *(ulong *)(CONCAT44(in_register_00000034,fComp) + lVar1))) == 0);
  }
  else {
    uVar4 = 0;
    do {
      if (uVar5 == uVar4) {
        return 0;
      }
      lVar1 = uVar4 * 8;
      puVar2 = pIn0 + uVar4;
      puVar3 = pOut + uVar4;
      uVar4 = uVar4 + 1;
    } while ((*puVar3 & ~(*(ulong *)(CONCAT44(in_register_00000034,fComp) + lVar1) ^ *puVar2)) == 0)
    ;
  }
  return 1;
}

Assistant:

static inline int Abc_TtIntersectXor( word * pOut, int fComp, word * pIn0, word * pIn1, int fComp01, int nWords )
{
    int w;
    if ( fComp01 )
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~(pIn0[w] ^ pIn1[w]) & ~pOut[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~(pIn0[w] ^ pIn1[w]) & pOut[w] )
                    return 1;
        }
    }
    else
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( (pIn0[w] ^ pIn1[w]) & ~pOut[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < nWords; w++ )
                if ( (pIn0[w] ^ pIn1[w]) & pOut[w] )
                    return 1;
        }
    }
    return 0;
}